

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

uint __thiscall wasm::Type::hasByteSize(Type *this)

{
  ulong uVar1;
  Type *pTVar2;
  Type *pTVar3;
  Type *pTVar4;
  bool bVar5;
  undefined1 local_38 [8];
  Iterator __begin2;
  
  uVar1 = this->id;
  if ((uVar1 & 1) == 0 || uVar1 < 7) {
    bVar5 = uVar1 - 2 < 5;
  }
  else {
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_38 = (undefined1  [8])this;
    pTVar2 = (Type *)size(this);
    bVar5 = pTVar2 == (Type *)0x0;
    if ((!bVar5) && (pTVar3 = Iterator::operator*((Iterator *)local_38), pTVar3->id - 2 < 5)) {
      pTVar3 = (Type *)0x1;
      do {
        bVar5 = pTVar2 == pTVar3;
        if (bVar5) break;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar3
        ;
        pTVar4 = Iterator::operator*((Iterator *)local_38);
        pTVar3 = (Type *)((long)&pTVar3->id + 1);
      } while (pTVar4->id - 2 < 5);
    }
  }
  return (uint)bVar5;
}

Assistant:

unsigned Type::hasByteSize() const {
  auto hasSingleByteSize = [](Type t) { return t.isNumber(); };
  if (isTuple()) {
    for (const auto& t : *this) {
      if (!hasSingleByteSize(t)) {
        return false;
      }
    }
    return true;
  }
  return hasSingleByteSize(*this);
}